

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_plus.c
# Opt level: O2

MPP_RET set_regs_parameters(AvsdHalCtx_t *p_hal,HalDecTask *task)

{
  RK_U32 *pRVar1;
  RK_S32 idx;
  uint uVar2;
  RK_U32 RVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  RK_S32 idx_00;
  RK_U32 RVar10;
  ushort uVar11;
  RK_S32 idx_01;
  int iVar12;
  
  pRVar1 = p_hal->p_regs;
  pRVar1[2] = pRVar1[2] | 0x800000;
  uVar2 = p_hal->work_out;
  if ((int)uVar2 < 0) {
    uVar2 = get_queue_pic(p_hal);
    p_hal->work_out = uVar2;
    if ((int)uVar2 < 0) {
      _mpp_log_l(2,"hal_avsd_plus","cannot get a pic_info buffer.\n","set_regs_parameters");
      return MPP_NOK;
    }
  }
  p_hal->pic[uVar2].slot_idx = task->output;
  p_hal->pic[uVar2].pic_code_type = (p_hal->syn).pp.picCodingType;
  p_hal->pic[uVar2].picture_distance = (p_hal->syn).pp.pictureDistance;
  set_defalut_parameters(p_hal);
  uVar4 = (p_hal->syn).pp.horizontalSize * 0x80000 + 0x780000 & 0xff800000;
  uVar2 = pRVar1[4];
  pRVar1[4] = uVar2 & 0x7fffff | uVar4;
  uVar5 = pRVar1[3];
  pRVar1[3] = uVar5 & 0xfffffff | 0xb0000000;
  if ((p_hal->syn).pp.pictureStructure == 1) {
    uVar5 = uVar5 & 0xf37ffff | 0xb0000000;
  }
  else {
    pRVar1[3] = uVar5 & 0xf3fffff | 0xb0c00000;
    uVar5 = uVar5 & 0xf37ffff | 0xb0c00000;
    if ((p_hal->syn).pp.topFieldFirst == 0) {
      uVar5 = (uint)(p_hal->first_field == 0) << 0x13 | uVar5;
    }
    else {
      uVar5 = (p_hal->first_field & 1) << 0x13 | uVar5;
    }
  }
  pRVar1[3] = uVar5;
  pRVar1[4] = uVar2 & 0x7807ff | uVar4 | (p_hal->syn).pp.verticalSize * 0x80 + 0x780 & 0x7f800;
  pRVar1[7] = pRVar1[7] & 0xfdffffff | (p_hal->syn).pp.verticalSize * 0x2000 + 0x1e000 & 0x2000000;
  uVar2 = (uint)((p_hal->syn).pp.picCodingType == 2) << 0x15;
  pRVar1[3] = uVar2 | uVar5 & 0xffdfffff;
  pRVar1[3] = uVar2 | uVar5 & 0xffcfffff | (uint)((p_hal->syn).pp.picCodingType != 0) << 0x14;
  pRVar1[5] = pRVar1[5] & 0x3ffffff | p_hal->data_offset << 0x1d;
  *(byte *)&p_hal->data_offset = (byte)p_hal->data_offset & 0xf8;
  RVar3 = get_packet_fd(p_hal,task->input);
  pRVar1[0xc] = RVar3;
  mpp_dev_set_reg_offset(p_hal->dev,0xc,p_hal->data_offset);
  uVar5 = (uint)*(byte *)((long)pRVar1 + 0x1b) << 0x18;
  uVar2 = (p_hal->syn).bitstream_size - p_hal->data_offset & 0xffffff;
  pRVar1[6] = uVar2 | uVar5;
  pRVar1[3] = pRVar1[3] & 0xffffdfff | ((p_hal->syn).pp.fixedPictureQp & 1) << 0xd;
  pRVar1[6] = uVar2 | uVar5 & 0x81ffffff | ((p_hal->syn).pp.pictureQp & 0x3f) << 0x19;
  RVar3 = (p_hal->syn).pp.profileId;
  uVar2 = pRVar1[0x2c];
  uVar5 = (uint)(RVar3 == 0x48) << 0x1a;
  pRVar1[0x2c] = uVar5 | uVar2 & 0xfbffffff;
  if (RVar3 == 0x48) {
    uVar6 = ((p_hal->syn).pp.weightingQuantFlag & 1) << 0x19;
    pRVar1[0x2c] = uVar5 | uVar2 & 0xf9ffffff | uVar6;
    uVar7 = ((p_hal->syn).pp.aecEnable & 1) << 0x16;
    pRVar1[0x2c] = uVar5 | uVar2 & 0xf9bfffff | uVar6 | uVar7;
    uVar8 = ((p_hal->syn).pp.noForwardReferenceFlag & 1) << 0x15;
    pRVar1[0x2c] = uVar5 | uVar2 & 0xf99fffff | uVar6 | uVar7 | uVar8;
    uVar4 = ((p_hal->syn).pp.pbFieldEnhancedFlag & 1) << 0x14;
    pRVar1[0x2c] = uVar5 | uVar2 & 0xf98fffff | uVar6 | uVar7 | uVar8 | uVar4;
    if (((p_hal->syn).pp.weightingQuantFlag == 0) || ((p_hal->syn).pp.chromaQuantParamDisable != 0))
    {
      uVar4 = uVar5 | uVar2 & 0xf98000ff | uVar6 | uVar7 | uVar8 | uVar4;
    }
    else {
      uVar9 = ((p_hal->syn).pp.chromaQuantParamDeltaCb & 0x3fU) << 0xe;
      pRVar1[0x2c] = uVar5 | uVar2 & 0xf9803fff | uVar6 | uVar7 | uVar8 | uVar4 | uVar9;
      uVar4 = uVar5 | uVar2 & 0xf98000ff | uVar6 | uVar7 | uVar8 | uVar4 | uVar9 |
              ((p_hal->syn).pp.chromaQuantParamDeltaCr & 0x3fU) << 8;
    }
    pRVar1[0x2c] = uVar4;
    if ((p_hal->syn).pp.weightingQuantFlag != 0) {
      uVar2 = uVar4 & 0xfe7fffff | ((p_hal->syn).pp.weightingQuantModel & 3) << 0x17;
      pRVar1[0x2c] = uVar2;
      pRVar1[0x2c] = CONCAT31((int3)(uVar2 >> 8),(char)(p_hal->syn).pp.weightingQuantParam[0]);
      *(char *)((long)pRVar1 + 0xab) = (char)(p_hal->syn).pp.weightingQuantParam[1];
      uVar5 = (p_hal->syn).pp.weightingQuantParam[2] << 0x18;
      uVar2 = pRVar1[0x2b];
      pRVar1[0x2b] = uVar2 & 0xffffff | uVar5;
      uVar4 = ((p_hal->syn).pp.weightingQuantParam[3] & 0xff) << 0x10;
      pRVar1[0x2b] = uVar2 & 0xffff | uVar5 | uVar4;
      uVar2 = uVar2 & 0xff | uVar5 | uVar4 | ((p_hal->syn).pp.weightingQuantParam[4] & 0xff) << 8;
      pRVar1[0x2b] = uVar2;
      pRVar1[0x2b] = CONCAT31((int3)(uVar2 >> 8),(char)(p_hal->syn).pp.weightingQuantParam[5]);
    }
  }
  if (((p_hal->syn).pp.pictureStructure == 1) || (p_hal->first_field != 0)) {
    RVar3 = get_frame_fd(p_hal,task->output);
    pRVar1[0xd] = RVar3;
  }
  else {
    RVar3 = (p_hal->syn).pp.horizontalSize;
    RVar10 = get_frame_fd(p_hal,task->output);
    pRVar1[0xd] = RVar10;
    mpp_dev_set_reg_offset(p_hal->dev,0xd,RVar3);
  }
  iVar12 = task->refer[0];
  if (iVar12 < 0) {
    iVar12 = task->output;
  }
  idx = task->refer[1];
  if (task->refer[1] < 0) {
    idx = iVar12;
  }
  idx_00 = iVar12;
  idx_01 = idx;
  if (((p_hal->first_field == 0) && ((p_hal->syn).pp.pictureStructure == 0)) &&
     ((p_hal->syn).pp.picCodingType != 2)) {
    idx_00 = task->output;
    idx_01 = iVar12;
  }
  RVar3 = get_frame_fd(p_hal,idx_00);
  pRVar1[0xe] = RVar3;
  RVar3 = get_frame_fd(p_hal,iVar12);
  pRVar1[0xf] = RVar3;
  RVar3 = get_frame_fd(p_hal,idx_01);
  pRVar1[0x10] = RVar3;
  RVar3 = get_frame_fd(p_hal,idx);
  pRVar1[0x11] = RVar3;
  RVar3 = (p_hal->syn).pp.picCodingType;
  uVar2 = p_hal->work0;
  if ((p_hal->syn).pp.pictureStructure == 1) {
    if (RVar3 == 2) {
      if (((int)uVar2 < 0) ||
         (uVar2 = (p_hal->pic[uVar2].picture_distance - (p_hal->syn).pp.pictureDistance) * 2 & 0x1fe
         , uVar2 == 0)) {
        uVar2 = 2;
      }
      RVar10 = uVar2 * 0x10001;
      pRVar1[0x1f] = RVar10;
      RVar3 = (0x200 / uVar2) * 0x10001;
      pRVar1[0x1d] = RVar3;
      if (-1 < (long)p_hal->work1) {
        uVar5 = (p_hal->syn).pp.pictureDistance - p_hal->pic[p_hal->work1].picture_distance & 0xff;
        uVar2 = 2;
        if (uVar5 != 0) {
          uVar2 = uVar5 * 2;
        }
        RVar10 = uVar2 * 0x10001;
        RVar3 = (0x200 / uVar2) * 0x10001;
      }
      pRVar1[0x1e] = RVar10;
      pRVar1[0x1c] = RVar3;
      uVar11 = (ushort)uVar2;
      if ((-1 < (long)p_hal->work0) && (-1 < (long)p_hal->work1)) {
        uVar2 = p_hal->pic[p_hal->work0].picture_distance -
                p_hal->pic[p_hal->work1].picture_distance & 0xff;
        uVar11 = 2;
        if (uVar2 != 0) {
          uVar11 = (short)uVar2 * 2;
        }
      }
      pRVar1[0x20] = (0x4000 / uVar11) * 0x10001;
      uVar2 = ((uint)(0x4000 / (long)p_hal->future2prev_past_dist) & 0xffff) * 0x10001;
      goto LAB_001d9c71;
    }
    if (((int)uVar2 < 0) ||
       (uVar5 = ((p_hal->syn).pp.pictureDistance - p_hal->pic[uVar2].picture_distance) * 2 & 0x1fe,
       uVar5 == 0)) {
      uVar5 = 2;
    }
    RVar3 = uVar5 * 0x10001;
    pRVar1[0x1e] = RVar3;
    uVar2 = (0x200 / uVar5) * 0x10001;
    pRVar1[0x1c] = uVar2;
    if (-1 < (long)p_hal->work1) {
      uVar2 = (p_hal->syn).pp.pictureDistance - p_hal->pic[p_hal->work1].picture_distance & 0xff;
      uVar5 = 2;
      if (uVar2 != 0) {
        uVar5 = uVar2 * 2;
      }
      RVar3 = uVar5 * 0x10001;
      uVar2 = (0x200 / uVar5) * 0x10001;
    }
    p_hal->future2prev_past_dist = uVar5;
    pRVar1[0x1f] = RVar3;
LAB_001d9c06:
    pRVar1[0x1d] = uVar2;
    pRVar1[0x20] = 0;
    pRVar1[0x21] = 0;
  }
  else {
    if (RVar3 != 2) {
      if (((int)uVar2 < 0) ||
         (uVar2 = ((p_hal->syn).pp.pictureDistance - p_hal->pic[uVar2].picture_distance) * 2 & 0x1fe
         , uVar2 == 0)) {
        uVar2 = 2;
      }
      if (p_hal->first_field == 0) {
        uVar5 = 1;
        *(ushort *)(pRVar1 + 0x1f) = (ushort)uVar2 | 1;
        *(short *)(pRVar1 + 0x1d) = (short)(0x200 / (uVar2 | 1));
        uVar4 = 0x200;
      }
      else {
        uVar5 = uVar2 - 1;
        uVar4 = 0x200 / (uVar5 & 0xffff);
      }
      pRVar1[0x1e] = uVar2 << 0x10 | uVar5;
      pRVar1[0x1c] = 0x200 / uVar2 << 0x10 | uVar4;
      if ((-1 < (long)p_hal->work1) &&
         (uVar5 = (p_hal->syn).pp.pictureDistance - p_hal->pic[p_hal->work1].picture_distance & 0xff
         , uVar2 = uVar5 * 2, uVar5 == 0)) {
        uVar2 = 2;
      }
      p_hal->future2prev_past_dist = uVar2;
      if (p_hal->first_field == 0) {
        *(short *)((long)pRVar1 + 0x7e) = (short)uVar2;
        uVar2 = 0x200 / uVar2 << 0x10 | (uint)(ushort)pRVar1[0x1d];
      }
      else {
        pRVar1[0x1f] = uVar2 << 0x10 | uVar2 - 1 & 0xffff;
        uVar2 = 0x200 / uVar2 << 0x10 | 0x200 / (int)(short)(uVar2 - 1) & 0xffffU;
      }
      goto LAB_001d9c06;
    }
    if (((int)uVar2 < 0) ||
       (uVar2 = (p_hal->pic[uVar2].picture_distance - (p_hal->syn).pp.pictureDistance) * 2 & 0x1fe,
       uVar2 == 0)) {
      uVar2 = 2;
    }
    uVar11 = (ushort)uVar2;
    if (p_hal->first_field == 0) {
      uVar11 = uVar11 - 1;
      uVar4 = uVar2 * 0x10001 - 1;
      uVar5 = uVar2;
    }
    else {
      uVar4 = (uVar2 | 1) << 0x10 | uVar2;
      uVar5 = uVar2 | 1;
    }
    pRVar1[0x1f] = uVar4;
    pRVar1[0x1d] = 0x200 / uVar5 << 0x10 | 0x200 / uVar11;
    if (-1 < (long)p_hal->work1) {
      uVar5 = (p_hal->syn).pp.pictureDistance - p_hal->pic[p_hal->work1].picture_distance & 0xff;
      uVar2 = 2;
      if (uVar5 != 0) {
        uVar2 = uVar5 * 2;
      }
    }
    if (p_hal->first_field == 0) {
      uVar4 = uVar2 + 1;
      uVar6 = uVar4 * 0x10000 | uVar2;
      uVar5 = 0x200 / uVar2;
    }
    else {
      uVar6 = uVar2 << 0x10 | uVar2 - 1 & 0xffff;
      uVar5 = 0x200 / (int)(short)(uVar2 - 1) & 0xffff;
      uVar4 = uVar2;
    }
    pRVar1[0x1e] = uVar6;
    pRVar1[0x1c] = 0x200 / uVar4 << 0x10 | uVar5;
    if ((-1 < (long)p_hal->work0) && (-1 < (long)p_hal->work1)) {
      uVar5 = p_hal->pic[p_hal->work0].picture_distance - p_hal->pic[p_hal->work1].picture_distance
              & 0xff;
      uVar2 = 2;
      if (uVar5 != 0) {
        uVar2 = uVar5 * 2;
      }
    }
    if ((p_hal->syn).pp.pbFieldEnhancedFlag == 0) {
      if (p_hal->first_field != 0) goto LAB_001d9c1c;
      pRVar1[0x20] = 0x4000 / uVar2 << 0x10 | 0x4000;
      *(short *)(pRVar1 + 0x21) = (short)(0x4000 / (uVar2 + 1));
LAB_001d9c41:
      iVar12 = p_hal->future2prev_past_dist;
      if (p_hal->first_field == 0) {
        *(short *)((long)pRVar1 + 0x86) = (short)(0x4000 / (long)iVar12);
        goto LAB_001d9c78;
      }
    }
    else {
      if (p_hal->first_field != 0) {
LAB_001d9c1c:
        pRVar1[0x20] = 0x4000 / uVar2 << 0x10 | 0x4000 / (int)(short)((short)uVar2 + -1) & 0xffffU;
        goto LAB_001d9c41;
      }
      pRVar1[0x20] = 0x4000 / uVar2 << 0x10 | 0x4000 / (int)(short)((short)uVar2 + -1) & 0xffffU;
      iVar12 = p_hal->future2prev_past_dist;
    }
    uVar2 = (int)(0x4000 / (long)iVar12) << 0x10 | (uint)(0x4000 / (long)(iVar12 + -1)) & 0xffff;
LAB_001d9c71:
    pRVar1[0x21] = uVar2;
  }
LAB_001d9c78:
  if ((pRVar1[0x2c] >> 0x1a & 1) != 0) {
    uVar2 = (uint)*(byte *)((long)pRVar1 + 0xab) << 0x18;
    pRVar1[0x2a] = uVar2;
    if (((p_hal->syn).pp.pictureStructure == 0) && ((p_hal->syn).pp.picCodingType == 2)) {
      pRVar1[0x2a] = uVar2 | 0x410000;
      uVar5 = 0x410400;
      if (p_hal->first_field == 0) {
        uVar5 = 0x410036;
      }
      pRVar1[0x2a] = uVar5 | uVar2;
    }
  }
  pRVar1[0x30] = pRVar1[0x30] & 0x3fff;
  uVar4 = ((p_hal->syn).pp.loopFilterDisable & 1) << 0xe;
  uVar2 = pRVar1[3];
  pRVar1[3] = uVar2 & 0xffffbfff | uVar4;
  uVar6 = ((p_hal->syn).pp.alphaOffset & 0x1fU) << 5;
  uVar5 = pRVar1[5];
  pRVar1[5] = uVar5 & 0xfffffc1f | uVar6;
  pRVar1[5] = uVar5 & 0xfffffc00 | uVar6 | (p_hal->syn).pp.betaOffset & 0x1fU;
  uVar6 = ((p_hal->syn).pp.skipModeFlag & 1) << 0x1a;
  uVar5 = uVar2 & 0xfbffbfff | uVar4 | uVar6;
  pRVar1[3] = uVar5;
  pRVar1[4] = pRVar1[4] & 0xfffffffe | (p_hal->syn).pp.pictureReferenceFlag & 1;
  pRVar1[3] = uVar2 & 0xfbffafff | uVar4 | uVar6;
  uVar2 = (p_hal->syn).pp.picCodingType;
  if ((pRVar1[0x2c] >> 0x1a & 1) == 0) {
    if (uVar2 == 1) {
LAB_001d9d87:
      pRVar1[3] = uVar5 | 0x1000;
      goto LAB_001d9d91;
    }
    if (uVar2 != 0) goto LAB_001d9d91;
    if (p_hal->first_field == 0) goto LAB_001d9d87;
  }
  else {
    if (uVar2 < 2) goto LAB_001d9d87;
LAB_001d9d91:
    if ((p_hal->first_field == 0) &&
       (((p_hal->syn).pp.picCodingType != 2 || (p_hal->prev_pic_structure == 0)))) {
      RVar3 = (p_hal->syn).pp.horizontalSize;
      RVar10 = (p_hal->syn).pp.verticalSize;
      if ((p_hal->syn).pp.progressiveFrame == 0) {
        uVar2 = RVar10 + 0x1f >> 4 & 0xfffffffe;
      }
      else {
        uVar2 = RVar10 + 0xf >> 4;
      }
      RVar10 = mpp_buffer_get_fd_with_caller(p_hal->mv_buf,"set_regs_parameters");
      pRVar1[0x29] = RVar10;
      mpp_dev_set_reg_offset
                (p_hal->dev,0x29,(RVar3 + 0xf >> 1 & 0xfffffff8) * uVar2 + 0x10 & 0xffffffe0);
      goto LAB_001d9e2a;
    }
  }
  RVar3 = mpp_buffer_get_fd_with_caller(p_hal->mv_buf,"set_regs_parameters");
  pRVar1[0x29] = RVar3;
LAB_001d9e2a:
  if ((*(byte *)((long)pRVar1 + 0xb3) & 4) != 0) {
    RVar3 = mpp_buffer_get_fd_with_caller(p_hal->mv_buf,"set_regs_parameters");
    pRVar1[0x2d] = RVar3;
  }
  uVar2 = 1;
  if (((-1 < (long)p_hal->work0) && (p_hal->pic[p_hal->work0].pic_type != 0)) &&
     (uVar2 = 0, p_hal->first_field == 0)) {
    uVar2 = (uint)(p_hal->prev_pic_structure == 0);
  }
  pRVar1[0x12] = pRVar1[0x12] & 0xfffffffe | uVar2;
  if (p_hal->prev_pic_structure == 0) {
    mpp_dev_set_reg_offset(p_hal->dev,0x10,2);
    mpp_dev_set_reg_offset(p_hal->dev,0x11,3);
  }
  *(byte *)((long)pRVar1 + 0xd) = *(byte *)((long)pRVar1 + 0xd) & 0x7f;
  *(byte *)(pRVar1 + 1) = (byte)pRVar1[1] | 1;
  return MPP_OK;
}

Assistant:

static MPP_RET set_regs_parameters(AvsdHalCtx_t *p_hal, HalDecTask *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;

    AvsdSyntax_t *p_syn = &p_hal->syn;
    AvsdPlusRegs_t *p_regs = (AvsdPlusRegs_t *)p_hal->p_regs;

    p_regs->sw02.dec_timeout_e = 1;

    //!< set wrok_out pic info
    if (p_hal->work_out < 0) {
        p_hal->work_out = get_queue_pic(p_hal);
        if (p_hal->work_out < 0) {
            ret = MPP_NOK;
            mpp_err_f("cannot get a pic_info buffer.\n");
            goto __FAILED;
        }
    }
    {
        AvsdHalPic_t *p_work_out = &p_hal->pic[p_hal->work_out];

        p_work_out->slot_idx = task->output;
        p_work_out->pic_code_type = p_syn->pp.picCodingType;
        p_work_out->picture_distance = p_syn->pp.pictureDistance;
    }
    //!< set register
    set_defalut_parameters(p_hal);
    p_regs->sw04.pic_mb_width = (p_syn->pp.horizontalSize + 15) >> 4;
    p_regs->sw03.dec_mode = 11; //!< DEC_MODE_AVS

    if (p_syn->pp.pictureStructure == FRAMEPICTURE) {
        p_regs->sw03.pic_interlace_e = 0;
        p_regs->sw03.pic_fieldmode_e = 0;
        p_regs->sw03.pic_topfiled_e = 0;
    } else {
        p_regs->sw03.pic_interlace_e = 1;
        p_regs->sw03.pic_fieldmode_e = 1;
        if (p_syn->pp.topFieldFirst) {
            p_regs->sw03.pic_topfiled_e = p_hal->first_field;
        } else {
            p_regs->sw03.pic_topfiled_e = !p_hal->first_field;
        }
    }

    p_regs->sw04.pic_mb_height_p = (p_syn->pp.verticalSize + 15) >> 4;
    p_regs->sw07.avs_h_ext = (p_syn->pp.verticalSize + 15) >> 12;

    if (p_syn->pp.picCodingType == BFRAME) {
        p_regs->sw03.pic_b_e = 1;
    } else {
        p_regs->sw03.pic_b_e = 0;
    }
    p_regs->sw03.pic_inter_e = (p_syn->pp.picCodingType != IFRAME) ? 1 : 0;

    p_regs->sw05.strm_start_bit = 8 * (p_hal->data_offset & 0x7);
    p_hal->data_offset = (p_hal->data_offset & ~0x7);
    p_regs->sw12.rlc_vlc_base = get_packet_fd(p_hal, task->input);
    mpp_dev_set_reg_offset(p_hal->dev, 12, p_hal->data_offset);
    p_regs->sw06.stream_len = p_syn->bitstream_size - p_hal->data_offset;

    p_regs->sw03.pic_fixed_quant = p_syn->pp.fixedPictureQp;
    p_regs->sw06.init_qp = p_syn->pp.pictureQp;
    //!< AVS Plus stuff
    if (p_syn->pp.profileId == 0x48) {
        p_regs->sw44.dec_avsp_ena = 1;
    } else {
        p_regs->sw44.dec_avsp_ena = 0;
    }
    if (p_regs->sw44.dec_avsp_ena) {
        p_regs->sw44.weight_qp_e = p_syn->pp.weightingQuantFlag;
        p_regs->sw44.avs_aec_e = p_syn->pp.aecEnable;
        p_regs->sw44.no_fwd_ref_e = p_syn->pp.noForwardReferenceFlag;
        p_regs->sw44.pb_field_enhance_e = p_syn->pp.pbFieldEnhancedFlag;

        if (p_syn->pp.weightingQuantFlag
            && !p_syn->pp.chromaQuantParamDisable) {
            p_regs->sw44.qp_delta_cb = p_syn->pp.chromaQuantParamDeltaCb;
            p_regs->sw44.qp_delta_cr = p_syn->pp.chromaQuantParamDeltaCr;
        } else {
            p_regs->sw44.qp_delta_cb = 0;
            p_regs->sw44.qp_delta_cr = 0;
        }
        if (p_syn->pp.weightingQuantFlag) {
            p_regs->sw44.weight_qp_model = p_syn->pp.weightingQuantModel;
            p_regs->sw44.weight_qp_0 = p_syn->pp.weightingQuantParam[0];
            p_regs->sw42.weight_qp_1 = p_syn->pp.weightingQuantParam[1];
            p_regs->sw43.weight_qp_2 = p_syn->pp.weightingQuantParam[2];
            p_regs->sw43.weight_qp_3 = p_syn->pp.weightingQuantParam[3];
            p_regs->sw43.weight_qp_4 = p_syn->pp.weightingQuantParam[4];
            p_regs->sw43.weight_qp_5 = p_syn->pp.weightingQuantParam[5];
        }
    }
    //!< AVS Plus end
    if (p_syn->pp.pictureStructure == FRAMEPICTURE || p_hal->first_field) {
        p_regs->sw13.dec_out_base = get_frame_fd(p_hal, task->output);
    } else {
        //!< start of bottom field line
        RK_U32 stride = p_syn->pp.horizontalSize;

        p_regs->sw13.dec_out_base = get_frame_fd(p_hal, task->output);
        mpp_dev_set_reg_offset(p_hal->dev, 13, stride);
    }
    {
        RK_S32 tmp_fwd = -1;
        RK_S32 refer0 = -1;
        RK_S32 refer1 = -1;

        tmp_fwd = (p_hal->work1 < 0) ? p_hal->work0 : p_hal->work1;
        tmp_fwd = (tmp_fwd < 0) ? p_hal->work_out : tmp_fwd;

        refer0 = (task->refer[0] < 0) ? task->output : task->refer[0];
        refer1 = (task->refer[1] < 0) ? refer0 : task->refer[1];
        if (!p_hal->first_field
            && p_syn->pp.pictureStructure == FIELDPICTURE
            && p_syn->pp.picCodingType != BFRAME) {
            p_regs->sw14.refer0_base = get_frame_fd(p_hal, task->output);
            p_regs->sw15.refer1_base = get_frame_fd(p_hal, refer0);
            p_regs->sw16.refer2_base = get_frame_fd(p_hal, refer0);
            p_regs->sw17.refer3_base = get_frame_fd(p_hal, refer1);
        } else {
            p_regs->sw14.refer0_base = get_frame_fd(p_hal, refer0);
            p_regs->sw15.refer1_base = get_frame_fd(p_hal, refer0);
            p_regs->sw16.refer2_base = get_frame_fd(p_hal, refer1);
            p_regs->sw17.refer3_base = get_frame_fd(p_hal, refer1);
        }
    }
    //!< block distances
    if (p_syn->pp.pictureStructure == FRAMEPICTURE) {
        if (p_syn->pp.picCodingType == BFRAME) {
            RK_S32 tmp = 0;
            //!< current to future anchor
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_syn->pp.pictureDistance + 512) & 0x1FF;
            }
            //!< prevent division by zero
            if (!tmp) tmp = 2;
            p_regs->sw31.ref_dist_cur_2 = tmp;
            p_regs->sw31.ref_dist_cur_3 = tmp;
            p_regs->sw29.ref_invd_cur_2 = 512 / tmp;
            p_regs->sw29.ref_invd_cur_3 = 512 / tmp;

            //!< current to past anchor
            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            p_regs->sw30.ref_dist_cur_0 = tmp;
            p_regs->sw30.ref_dist_cur_1 = tmp;
            p_regs->sw28.ref_invd_cur_0 = 512 / tmp;
            p_regs->sw28.ref_invd_cur_1 = 512 / tmp;
            //!< future anchor to past anchor
            if (p_hal->work0 >= 0 && p_hal->work1 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            tmp = 16384 / tmp;
            p_regs->sw32.ref_invd_col_0 = tmp;
            p_regs->sw32.ref_invd_col_1 = tmp;
            //!< future anchor to previous past anchor
            tmp = p_hal->future2prev_past_dist;
            tmp = 16384 / tmp;
            p_regs->sw33.ref_invd_col_2 = tmp;
            p_regs->sw33.ref_invd_col_3 = tmp;
        } else {
            RK_S32 tmp = 0;
            //!< current to past anchor
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work0].picture_distance - 512) & 0x1FF;
            }
            if (!tmp) tmp = 2;
            p_regs->sw30.ref_dist_cur_0 = tmp;
            p_regs->sw30.ref_dist_cur_1 = tmp;
            p_regs->sw28.ref_invd_cur_0 = 512 / tmp;
            p_regs->sw28.ref_invd_cur_1 = 512 / tmp;
            //!< current to previous past anchor
            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            //!< this will become "future to previous past" for next B
            p_hal->future2prev_past_dist = tmp;

            p_regs->sw31.ref_dist_cur_2 = tmp;
            p_regs->sw31.ref_dist_cur_3 = tmp;
            p_regs->sw29.ref_invd_cur_2 = 512 / tmp;
            p_regs->sw29.ref_invd_cur_3 = 512 / tmp;

            p_regs->sw32.ref_invd_col_0 = 0;
            p_regs->sw32.ref_invd_col_1 = 0;
            p_regs->sw33.ref_invd_col_2 = 0;
            p_regs->sw33.ref_invd_col_3 = 0;
        }
    } else {
        //!< field interlaced
        if (p_syn->pp.picCodingType == BFRAME) {
            RK_S32 tmp = 0;
            //!< block distances
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_syn->pp.pictureDistance + 512) & 0x1FF;
            }
            //!< prevent division by zero
            if (!tmp) tmp = 2;

            if (p_hal->first_field) {
                p_regs->sw31.ref_dist_cur_2 = tmp;
                p_regs->sw31.ref_dist_cur_3 = tmp + 1;
                p_regs->sw29.ref_invd_cur_2 = 512 / tmp;
                p_regs->sw29.ref_invd_cur_3 = 512 / (tmp + 1);
            } else {
                p_regs->sw31.ref_dist_cur_2 = tmp - 1;
                p_regs->sw31.ref_dist_cur_3 = tmp;
                p_regs->sw29.ref_invd_cur_2 = 512 / (tmp - 1);
                p_regs->sw29.ref_invd_cur_3 = 512 / tmp;
            }

            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            if (p_hal->first_field) {
                p_regs->sw30.ref_dist_cur_0 = (tmp - 1);
                p_regs->sw30.ref_dist_cur_1 = tmp;
                p_regs->sw28.ref_invd_cur_0 = 512 / (tmp - 1);
                p_regs->sw28.ref_invd_cur_1 = 512 / tmp;
            } else {
                p_regs->sw30.ref_dist_cur_0 = tmp;
                p_regs->sw30.ref_dist_cur_1 = tmp + 1;
                p_regs->sw28.ref_invd_cur_0 = 512 / tmp;
                p_regs->sw28.ref_invd_cur_1 = 512 / (tmp + 1);
            }

            if (p_hal->work0 >= 0 && p_hal->work1 >= 0) {
                tmp = (2 * p_hal->pic[p_hal->work0].picture_distance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            //!< AVS Plus stuff
            if (p_syn->pp.pbFieldEnhancedFlag && !p_hal->first_field) {
                //!< in this case, BlockDistanceRef is different with before, the mvRef points to top field
                p_regs->sw32.ref_invd_col_0 = 16384 / (tmp - 1);
                p_regs->sw32.ref_invd_col_1 = 16384 / tmp;

                //!< future anchor to previous past anchor
                tmp = p_hal->future2prev_past_dist;

                p_regs->sw33.ref_invd_col_2 = 16384 / (tmp - 1);
                p_regs->sw33.ref_invd_col_3 = 16384 / tmp;
            } else {
                if (p_hal->first_field) {
                    p_regs->sw32.ref_invd_col_0 = 16384 / (tmp - 1);
                    p_regs->sw32.ref_invd_col_1 = 16384 / tmp;
                } else {
                    p_regs->sw32.ref_invd_col_0 = 16384;
                    p_regs->sw32.ref_invd_col_1 = 16384 / tmp;
                    p_regs->sw33.ref_invd_col_2 = 16384 / (tmp + 1);
                }

                //!< future anchor to previous past anchor
                tmp = p_hal->future2prev_past_dist;

                if (p_hal->first_field) {
                    p_regs->sw33.ref_invd_col_2 = 16384 / (tmp - 1);
                    p_regs->sw33.ref_invd_col_3 = 16384 / tmp;
                } else {
                    p_regs->sw33.ref_invd_col_3 = 16384 / tmp;
                }
            }
        } else {
            RK_S32 tmp = 0;
            if (p_hal->work0 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work0].picture_distance - 512) & 0x1FF;
            }
            if (!tmp) tmp = 2;

            if (!p_hal->first_field) {
                p_regs->sw30.ref_dist_cur_0 = 1;
                p_regs->sw31.ref_dist_cur_2 = tmp + 1;

                p_regs->sw28.ref_invd_cur_0 = 512;
                p_regs->sw29.ref_invd_cur_2 = 512 / (tmp + 1);
            } else {
                p_regs->sw30.ref_dist_cur_0 = tmp - 1;
                p_regs->sw28.ref_invd_cur_0 = 512 / (tmp - 1);
            }
            p_regs->sw30.ref_dist_cur_1 = tmp;
            p_regs->sw28.ref_invd_cur_1 = 512 / tmp;

            if (p_hal->work1 >= 0) {
                tmp = (2 * p_syn->pp.pictureDistance -
                       2 * p_hal->pic[p_hal->work1].picture_distance - 512) & 0x1FF;
                if (!tmp) tmp = 2;
            }
            //!< this will become "future to previous past" for next B
            p_hal->future2prev_past_dist = tmp;
            if (p_hal->first_field) {
                p_regs->sw31.ref_dist_cur_2 = tmp - 1;
                p_regs->sw31.ref_dist_cur_3 = tmp;

                p_regs->sw29.ref_invd_cur_2 = 512 / (tmp - 1);
                p_regs->sw29.ref_invd_cur_3 = 512 / tmp;
            } else {
                p_regs->sw31.ref_dist_cur_3 = tmp;
                p_regs->sw29.ref_invd_cur_3 = 512 / tmp;
            }

            p_regs->sw32.ref_invd_col_0 = 0;
            p_regs->sw32.ref_invd_col_1 = 0;
            p_regs->sw33.ref_invd_col_2 = 0;
            p_regs->sw33.ref_invd_col_3 = 0;
        }
    }
    //!< AVS Plus stuff
    if (p_regs->sw44.dec_avsp_ena) {
        p_regs->sw42.ref_delta_col_0 = 0;
        p_regs->sw42.ref_delta_col_1 = 0;
        p_regs->sw42.ref_delta_col_2 = 0;
        p_regs->sw42.ref_delta_col_3 = 0;
        p_regs->sw42.ref_delta_cur_0 = 0;
        p_regs->sw42.ref_delta_cur_1 = 0;
        p_regs->sw42.ref_delta_cur_2 = 0;
        p_regs->sw42.ref_delta_cur_3 = 0;
        if (p_syn->pp.pictureStructure == FIELDPICTURE
            && p_syn->pp.picCodingType == BFRAME) {
            //!< 1 means delta=2, 3 means delta=-2, 0 means delta=0
            //!< delta1
            p_regs->sw42.ref_delta_col_0 = 2;
            p_regs->sw42.ref_delta_col_1 = 0;
            p_regs->sw42.ref_delta_col_2 = 2;
            p_regs->sw42.ref_delta_col_3 = 0;
            if (p_hal->first_field) {
                //!< deltaFw
                p_regs->sw42.ref_delta_cur_0 = 2;
                p_regs->sw42.ref_delta_cur_1 = 0;
                //!< deltaBw
                p_regs->sw42.ref_delta_cur_2 = 0;
                p_regs->sw42.ref_delta_cur_3 = 0;
            } else {
                //!< deltaFw
                p_regs->sw42.ref_delta_cur_0 = 0;
                p_regs->sw42.ref_delta_cur_1 = 0;
                //!< deltaBw
                p_regs->sw42.ref_delta_cur_2 = 6; //!< (RK_U32)-2
                p_regs->sw42.ref_delta_cur_3 = 6; //!< (RK_U32)-2
            }
        }
    }
    //!< AVS Plus end

    p_regs->sw48.startmb_x = 0;
    p_regs->sw48.startmb_y = 0;

    p_regs->sw03.filtering_dis = p_syn->pp.loopFilterDisable;
    p_regs->sw05.alpha_offset = p_syn->pp.alphaOffset;
    p_regs->sw05.beta_offset = p_syn->pp.betaOffset;
    p_regs->sw03.skip_mode = p_syn->pp.skipModeFlag;
    p_regs->sw04.pic_refer_flag = p_syn->pp.pictureReferenceFlag;

    //!< AVS Plus change
    p_regs->sw03.write_mvs_e = 0;
    if (p_regs->sw44.dec_avsp_ena) {
        if (p_syn->pp.picCodingType == PFRAME
            || p_syn->pp.picCodingType == IFRAME) {
            p_regs->sw03.write_mvs_e = 1;
        }
    } else {
        if (p_syn->pp.picCodingType == PFRAME
            || (p_syn->pp.picCodingType == IFRAME && !p_hal->first_field)) {
            p_regs->sw03.write_mvs_e = 1;
        }
    }
    //!< AVS Plus end
    //!< set mv base
    if (p_hal->first_field ||
        (p_syn->pp.picCodingType == BFRAME && p_hal->prev_pic_structure)) {
        p_regs->sw41.dir_mv_base = mpp_buffer_get_fd(p_hal->mv_buf);
    } else {
        RK_U32 frame_width = 0, frame_height = 0, offset = 0;
        frame_width = (p_syn->pp.horizontalSize + 15) >> 4;
        if (p_syn->pp.progressiveFrame)
            frame_height = (p_syn->pp.verticalSize + 15) >> 4;
        else
            frame_height = 2 * ((p_syn->pp.verticalSize + 31) >> 5);
        offset = MPP_ALIGN(frame_width * frame_height / 2, 2) * 16;
        p_regs->sw41.dir_mv_base = mpp_buffer_get_fd(p_hal->mv_buf);
        mpp_dev_set_reg_offset(p_hal->dev, 41, offset);
    }
    //!< AVS Plus stuff
    if (p_regs->sw44.dec_avsp_ena) {
        p_regs->sw45.dir_mv_base2 = mpp_buffer_get_fd(p_hal->mv_buf);
    }
    //!< AVS Plus end
    {
        RK_U32 pic_type = 0;
        RK_U32 prev_anc_type = 0;

        if (p_hal->work0 >= 0) {
            pic_type = p_hal->pic[p_hal->work0].pic_type;
        }
        prev_anc_type = !pic_type || (!p_hal->first_field && !p_hal->prev_pic_structure);
        p_regs->sw18.prev_anc_type = prev_anc_type;
    }
    //!< b-picture needs to know if future reference is field or frame coded
    // p_regs->sw16.refer2_field_e = (!p_hal->prev_pic_structure) ? 1 : 0;
    // p_regs->sw17.refer3_field_e = (!p_hal->prev_pic_structure) ? 1 : 0;
    if (!p_hal->prev_pic_structure) {
        mpp_dev_set_reg_offset(p_hal->dev, 16, 2);
        mpp_dev_set_reg_offset(p_hal->dev, 17, 3);
    }

    p_regs->sw03.dec_out_dis = 0;
    p_regs->sw01.dec_e = 1;

    return MPP_OK;
__FAILED:
    return ret;
}